

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

char * get_family(xc_func_type *func)

{
  int iVar1;
  long *in_RDI;
  char *local_8;
  
  iVar1 = *(int *)(*in_RDI + 0x10);
  if (iVar1 == -1) {
    local_8 = "XC_FAMILY_UNKNOWN";
  }
  else if (iVar1 == 1) {
    local_8 = "XC_FAMILY_LDA";
  }
  else if (iVar1 == 2) {
    local_8 = "XC_FAMILY_GGA";
  }
  else if (iVar1 == 4) {
    local_8 = "XC_FAMILY_MGGA";
  }
  else if (iVar1 == 8) {
    local_8 = "XC_FAMILY_LCA";
  }
  else if (iVar1 == 0x10) {
    local_8 = "XC_FAMILY_OEP";
  }
  else if (iVar1 == 0x20) {
    local_8 = "XC_FAMILY_HYB_GGA";
  }
  else if (iVar1 == 0x40) {
    local_8 = "XC_FAMILY_HYB_MGGA";
  }
  else if (iVar1 == 0x80) {
    local_8 = "XC_FAMILY_HYB_LDA";
  }
  else {
    printf("Internal error in get_family.\n");
    local_8 = "";
  }
  return local_8;
}

Assistant:

const char *get_family(const xc_func_type *func) {
  switch(func->info->family) {
    case(XC_FAMILY_UNKNOWN):
      return "XC_FAMILY_UNKNOWN";

    case(XC_FAMILY_LDA):
      return "XC_FAMILY_LDA";

    case(XC_FAMILY_HYB_LDA):
      return "XC_FAMILY_HYB_LDA";

    case(XC_FAMILY_GGA):
      return "XC_FAMILY_GGA";

    case(XC_FAMILY_HYB_GGA):
      return "XC_FAMILY_HYB_GGA";

    case(XC_FAMILY_MGGA):
      return "XC_FAMILY_MGGA";

    case(XC_FAMILY_HYB_MGGA):
      return "XC_FAMILY_HYB_MGGA";

    case(XC_FAMILY_LCA):
      return "XC_FAMILY_LCA";

    case(XC_FAMILY_OEP):
      return "XC_FAMILY_OEP";

    default:
      printf("Internal error in get_family.\n");
      return "";
  }
}